

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadLocalStorage.h
# Opt level: O0

void __thiscall TLS::BASE<tls_data_t,_1024U>::_details::~_details(_details *this)

{
  bool bVar1;
  iterator pvVar2;
  pointer this_00;
  value_type *x;
  iterator __end0;
  iterator __begin0;
  array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *__range4;
  int result;
  _details *this_local;
  
  pthread_key_delete(BASE<tls_data_t,1024u>::_details::_pthread_key);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&BASE<tls_data_t,1024u>::_details::_thread_exit_callback);
  if (bVar1) {
    __end0 = std::array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL>::begin(&this->_data);
    pvVar2 = std::array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL>::end(&this->_data);
    for (; __end0 != pvVar2; __end0 = __end0 + 1) {
      if (__end0->_index != 0xffffffff) {
        this_00 = std::
                  unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
                  ::operator->((unique_ptr<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>,_std::default_delete<std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>_>_>
                                *)&BASE<tls_data_t,1024u>::_details::_thread_exit_callback);
        std::function<void_(TLS::BASE<tls_data_t,_1024U>::data_t_&)>::operator()(this_00,__end0);
      }
    }
  }
  return;
}

Assistant:

~_details() {
#ifdef _MSC_VER
				for (auto & x : _thread_wait_handles) {
					if (x != IVH())
						unregister_wait_thread_handle(x);
				}
#else
				int result = pthread_key_delete(_pthread_key);
				TLS_ASSERT_(result == 0); (void)result;
#endif
				if (_thread_exit_callback) {
					for (auto &x : _data) {
						if (x._index != UNUSED_INDEX)
							_thread_exit_callback->operator()(x);
					}
				}
			}